

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# MP1Node.cpp
# Opt level: O2

short __thiscall MP1Node::getPortFromAddress(MP1Node *this,string *address)

{
  int iVar1;
  string local_30;
  
  std::__cxx11::string::find((char *)address,0x1070b8);
  std::__cxx11::string::substr((ulong)&local_30,(ulong)address);
  iVar1 = std::__cxx11::stoi(&local_30,(size_t *)0x0,10);
  std::__cxx11::string::~string((string *)&local_30);
  return (short)iVar1;
}

Assistant:

short MP1Node::getPortFromAddress(string address) {
    size_t pos = address.find(":");
    short port = (short)stoi(address.substr(pos + 1, address.size()-pos-1));
    return port;
}